

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion * __thiscall QRegion::operator^=(QRegion *this,QRegion *r)

{
  QRegionData *pQVar1;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  xored(&local_20,this);
  pQVar1 = this->d;
  this->d = (QRegionData *)local_20;
  local_20.d = pQVar1;
  ~QRegion(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion& QRegion::operator^=(const QRegion &r)
    { return *this = *this ^ r; }